

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleCompareCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  char *value;
  cmMakefile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string e;
  allocator<char> local_51;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"sub-command COMPARE requires a mode to be specified.",&local_51)
    ;
    cmCommand::SetError(&this->super_cmCommand,&local_50);
LAB_00286f53:
    std::__cxx11::string::~string((string *)&local_50);
    return false;
  }
  __lhs_00 = pbVar1 + 1;
  bVar2 = std::operator==(__lhs_00,"EQUAL");
  if ((((!bVar2) && (bVar2 = std::operator==(__lhs_00,"NOTEQUAL"), !bVar2)) &&
      (bVar2 = std::operator==(__lhs_00,"LESS"), !bVar2)) &&
     (((bVar2 = std::operator==(__lhs_00,"LESS_EQUAL"), !bVar2 &&
       (bVar2 = std::operator==(__lhs_00,"GREATER"), !bVar2)) &&
      (bVar2 = std::operator==(__lhs_00,"GREATER_EQUAL"), !bVar2)))) {
    std::operator+(&local_50,"sub-command COMPARE does not recognize mode ",__lhs_00);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    goto LAB_00286f53;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x81) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"sub-command COMPARE, mode ",&local_51);
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    goto LAB_00286f53;
  }
  __lhs = pbVar1 + 2;
  __rhs = pbVar1 + 3;
  bVar2 = std::operator==(__lhs_00,"LESS");
  if (bVar2) {
    bVar2 = std::operator<(__lhs,__rhs);
LAB_00286fee:
    if (bVar2 != false) {
LAB_00286ff2:
      this_00 = (this->super_cmCommand).Makefile;
      value = "1";
      goto LAB_0028702b;
    }
  }
  else {
    bVar2 = std::operator==(__lhs_00,"LESS_EQUAL");
    if (bVar2) {
      bVar2 = std::operator<=(__lhs,__rhs);
      goto LAB_00286fee;
    }
    bVar2 = std::operator==(__lhs_00,"GREATER");
    if (bVar2) {
      bVar2 = std::operator>(__lhs,__rhs);
      goto LAB_00286fee;
    }
    bVar2 = std::operator==(__lhs_00,"GREATER_EQUAL");
    if (bVar2) {
      bVar2 = std::operator>=(__lhs,__rhs);
      goto LAB_00286fee;
    }
    bVar2 = std::operator==(__lhs_00,"EQUAL");
    _Var3 = std::operator==(__lhs,__rhs);
    if (bVar2 == _Var3) goto LAB_00286ff2;
  }
  this_00 = (this->super_cmCommand).Makefile;
  value = "0";
LAB_0028702b:
  cmMakefile::AddDefinition(this_00,pbVar1 + 4,value);
  return true;
}

Assistant:

bool cmStringCommand::HandleCompareCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e = "sub-command COMPARE, mode ";
      e += mode;
      e += " needs at least 5 arguments total to command.";
      this->SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      this->Makefile->AddDefinition(outvar, "1");
    } else {
      this->Makefile->AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  this->SetError(e);
  return false;
}